

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

lysc_node * lyd_node_schema(lyd_node *node)

{
  lyd_node *plVar1;
  lys_module *plVar2;
  bool bVar3;
  bool local_59;
  char *local_58;
  lys_module *mod;
  lyd_node *iter;
  lyd_node *prev_iter;
  lysc_node *schema;
  lyd_node *node_local;
  
  prev_iter = (lyd_node *)0x0;
  iter = (lyd_node *)0x0;
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else if (node->schema == (lysc_node *)0x0) {
    mod = (lys_module *)lyd_parent(node);
    while( true ) {
      bVar3 = false;
      if (mod != (lys_module *)0x0) {
        bVar3 = mod->name == (char *)0x0;
      }
      if (!bVar3) break;
      mod = (lys_module *)lyd_parent((lyd_node *)mod);
    }
    plVar2 = (lys_module *)node;
    if (mod != (lys_module *)0x0) {
      iter = (lyd_node *)mod;
      prev_iter = (lyd_node *)mod->name;
      plVar2 = (lys_module *)node;
    }
    do {
      while (mod = plVar2, plVar1 = lyd_parent((lyd_node *)mod), plVar1 != iter) {
        plVar2 = (lys_module *)lyd_parent((lyd_node *)mod);
      }
      plVar2 = lyd_node_module((lyd_node *)mod);
      if (plVar2 == (lys_module *)0x0) {
        prev_iter = (lyd_node *)0x0;
        break;
      }
      if (mod->name == (char *)0x0) {
        local_58 = mod->dsc;
      }
      else {
        local_58 = *(char **)(mod->name + 0x28);
      }
      prev_iter = (lyd_node *)lys_find_child((lysc_node *)prev_iter,plVar2,local_58,0,0,0);
      iter = (lyd_node *)mod;
      local_59 = (lysc_node *)prev_iter != (lysc_node *)0x0 && mod != (lys_module *)node;
      plVar2 = (lys_module *)node;
    } while (local_59);
    node_local = prev_iter;
  }
  else {
    node_local = (lyd_node *)node->schema;
  }
  return (lysc_node *)node_local;
}

Assistant:

lysc_node *
lyd_node_schema(const struct lyd_node *node)
{
    const struct lysc_node *schema = NULL;
    const struct lyd_node *prev_iter = NULL, *iter;
    const struct lys_module *mod;

    if (!node) {
        return NULL;
    } else if (node->schema) {
        return node->schema;
    }

    /* find the first schema node in the parents */
    for (iter = lyd_parent(node); iter && !iter->schema; iter = lyd_parent(iter)) {}
    if (iter) {
        prev_iter = iter;
        schema = prev_iter->schema;
    }

    /* get schema node of an opaque node */
    do {
        /* get next data node */
        for (iter = node; lyd_parent(iter) != prev_iter; iter = lyd_parent(iter)) {}

        /* get module */
        mod = lyd_node_module(iter);
        if (!mod) {
            /* unknown module, no schema node */
            schema = NULL;
            break;
        }

        /* get schema node */
        schema = lys_find_child(schema, mod, LYD_NAME(iter), 0, 0, 0);

        /* move to the descendant */
        prev_iter = iter;
    } while (schema && (iter != node));

    return schema;
}